

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void la_func_end(TCGContext_conflict9 *s,int ng,int nt)

{
  long lVar1;
  void **ppvVar2;
  
  if (0 < ng) {
    lVar1 = 0;
    do {
      *(undefined8 *)((long)&s->temps[0].state + lVar1) = 3;
      **(TCGRegSet **)((long)&s->temps[0].state_ptr + lVar1) =
           s->tcg_target_available_regs[(byte)(&s->temps[0].field_0x3)[lVar1]];
      lVar1 = lVar1 + 0x38;
    } while ((ulong)(uint)ng * 0x38 - lVar1 != 0);
  }
  if (ng < nt) {
    ppvVar2 = &s->temps[ng].state_ptr;
    lVar1 = (long)nt - (long)ng;
    do {
      ppvVar2[-1] = (void *)0x1;
      *(undefined4 *)*ppvVar2 = 0;
      ppvVar2 = ppvVar2 + 7;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

static void la_func_end(TCGContext *s, int ng, int nt)
{
    int i;

    for (i = 0; i < ng; ++i) {
        s->temps[i].state = TS_DEAD | TS_MEM;
        la_reset_pref(s, &s->temps[i]);
    }
    for (i = ng; i < nt; ++i) {
        s->temps[i].state = TS_DEAD;
        la_reset_pref(s, &s->temps[i]);
    }
}